

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

uint32_t __thiscall TldAddressAsKey::Hash(TldAddressAsKey *this)

{
  ulong local_20;
  size_t i_1;
  size_t i;
  TldAddressAsKey *this_local;
  
  if (this->hash == 0) {
    this->hash = 0xcacab0b0;
    for (i_1 = 0; i_1 < this->tld_len; i_1 = i_1 + 1) {
      this->hash = this->hash * 0x65 + (uint)this->tld[i_1];
    }
    for (local_20 = 0; local_20 < this->addr_len; local_20 = local_20 + 1) {
      this->hash = this->hash * 0x65 + (uint)this->addr[local_20];
    }
  }
  return this->hash;
}

Assistant:

uint32_t TldAddressAsKey::Hash()
{
    if (hash == 0)
    {
        hash = 0xCACAB0B0;

        for (size_t i = 0; i < tld_len; i++)
        {
            hash = hash * 101 + tld[i];
        }

        for (size_t i = 0; i < addr_len; i++)
        {
            hash = hash * 101 + addr[i];
        }
    }

    return hash;
}